

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::ShaderVkImpl::Initialize
          (ShaderVkImpl *this,ShaderCreateInfo *ShaderCI,CreateInfo *VkShaderCI)

{
  string *EntryPoint;
  SHADER_TYPE SVar1;
  IDXCompiler *pIVar2;
  RenderDeviceInfo *pRVar3;
  char *__s;
  char *pcVar4;
  SPIRVShaderResources *this_00;
  Version VVar5;
  Version VVar6;
  Version VVar7;
  Version VVar8;
  DeviceFeatures *pDVar9;
  pointer puVar10;
  pointer puVar11;
  SpirvVersion SVar12;
  uint uVar13;
  int iVar14;
  IMemoryAllocator *Allocator;
  undefined4 extraout_var;
  char (*Args_1) [50];
  ShaderMacro *pSVar15;
  ShaderDesc *shaderDesc;
  BuildGLSLSourceStringAttribs *extraout_RDX;
  BuildGLSLSourceStringAttribs *extraout_RDX_00;
  BuildGLSLSourceStringAttribs *extraout_RDX_01;
  BuildGLSLSourceStringAttribs *extraout_RDX_02;
  BuildGLSLSourceStringAttribs *extraout_RDX_03;
  BuildGLSLSourceStringAttribs *extraout_RDX_04;
  BuildGLSLSourceStringAttribs *Attribs;
  DEVICE_FEATURE_STATE *pDVar16;
  pointer *ppuVar17;
  char (*in_R8) [23];
  Char *CombinedSamplerSuffix;
  IDataBlob *pObj;
  pointer *ppuVar18;
  string GLSLSourceString;
  string msg;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  undefined1 local_f8 [32];
  Uint32 UStack_d8;
  Uint32 UStack_d4;
  Uint32 UStack_d0;
  Uint32 UStack_cc;
  SpirvVersion SStack_c8;
  Uint32 UStack_c4;
  Uint32 UStack_c0;
  undefined4 uStack_bc;
  ushort local_b8;
  char *local_b0;
  undefined8 local_a8;
  pointer *local_98;
  pointer *ppuStack_90;
  DeviceFeatures *local_88;
  String local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  STDDeleter<Diligent::SPIRVShaderResources,_Diligent::IMemoryAllocator> local_38;
  
  if (ShaderCI->FilePath == (Char *)0x0 && ShaderCI->Source == (Char *)0x0) {
    if (ShaderCI->ByteCode == (void *)0x0) {
      LogError<true,char[93]>
                (false,"Initialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                 ,0xd3,(char (*) [93])
                       "Shader source must be provided through one of the \'Source\', \'FilePath\' or \'ByteCode\' members"
                );
    }
    else {
      if ((ShaderCI->field_4).SourceLength == 0) {
        FormatString<char[27]>((string *)local_f8,(char (*) [27])"ByteCodeSize must not be 0");
        DebugAssertionFailed
                  ((Char *)local_f8._0_8_,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0xcc);
        if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
      }
      if (((ulong)ShaderCI->field_4 & 3) != 0) {
        FormatString<char[17],unsigned_long,char[23]>
                  ((string *)local_f8,(Diligent *)"Byte code size (",
                   (char (*) [17])&ShaderCI->field_4,(unsigned_long *)") is not multiple of 4",in_R8
                  );
        DebugAssertionFailed
                  ((Char *)local_f8._0_8_,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0xcd);
        if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->m_SPIRV,(ShaderCI->field_4).SourceLength >> 2);
      memcpy((this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start,ShaderCI->ByteCode,(ShaderCI->field_4).SourceLength);
    }
    goto LAB_00229480;
  }
  Attribs = (BuildGLSLSourceStringAttribs *)VkShaderCI;
  if (ShaderCI->ByteCode != (void *)0x0) {
    FormatString<char[74]>
              ((string *)local_f8,
               (char (*) [74])
               "\'ByteCode\' must be null when shader is created from source code or a file");
    DebugAssertionFailed
              ((Char *)local_f8._0_8_,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
               ,0xa9);
    Attribs = extraout_RDX;
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
      Attribs = extraout_RDX_00;
    }
  }
  Args_1 = (char (*) [50])(ulong)ShaderCI->ShaderCompiler;
  if (ShaderCI->ShaderCompiler == SHADER_COMPILER_DXC) {
    if (VkShaderCI->pDXCompiler != (IDXCompiler *)0x0) {
      iVar14 = (*VkShaderCI->pDXCompiler->_vptr_IDXCompiler[3])();
      Args_1 = (char (*) [50])0x2;
      Attribs = extraout_RDX_01;
      if ((char)iVar14 != '\0') goto LAB_00228f14;
    }
    FormatString<char[57]>
              ((string *)local_f8,
               (char (*) [57])"DX Compiler is not loaded. Using default shader compiler");
    Attribs = extraout_RDX_02;
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,local_f8._0_8_,0,0,0);
      Attribs = extraout_RDX_03;
    }
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
      Attribs = extraout_RDX_04;
    }
    Args_1 = (char (*) [50])0x0;
  }
LAB_00228f14:
  if ((uint)Args_1 < 2) {
    local_98 = (pointer *)0x0;
    ppuStack_90 = (pointer *)0x0;
    local_88 = (DeviceFeatures *)0x0;
    if ((ShaderCI->SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL) &&
       ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) ==
        SHADER_COMPILE_FLAG_NONE)) {
      GLSLangUtils::HLSLtoSPIRV
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,ShaderCI,Vk100,
                 "#ifndef VULKAN\n#   define VULKAN 1\n#endif\n\n",VkShaderCI->ppCompilerOutput);
      pDVar9 = local_88;
      ppuVar17 = local_98;
      local_98 = (pointer *)local_f8._0_8_;
      ppuStack_90 = (pointer *)local_f8._8_8_;
      local_88 = (DeviceFeatures *)local_f8._16_8_;
      local_f8._0_8_ = (pointer *)0x0;
      local_f8._8_8_ = (pointer *)0x0;
      local_f8._16_8_ = (DeviceFeatures *)0x0;
      if (ppuVar17 != (pointer *)0x0) {
        operator_delete(ppuVar17,(long)pDVar9 - (long)ppuVar17);
      }
      if ((pointer *)local_f8._0_8_ != (pointer *)0x0) {
        pDVar16 = (DEVICE_FEATURE_STATE *)(local_f8._16_8_ - local_f8._0_8_);
        ppuVar17 = (pointer *)local_f8._0_8_;
LAB_002293b0:
        operator_delete(ppuVar17,(ulong)pDVar16);
      }
    }
    else {
      local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)local_118.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      if (ShaderCI->SourceLanguage == SHADER_SOURCE_LANGUAGE_GLSL_VERBATIM) {
        ReadShaderSourceFile
                  ((ShaderSourceFileData *)local_f8,ShaderCI->Source,
                   (ShaderCI->field_4).SourceLength,ShaderCI->pShaderSourceStreamFactory,
                   ShaderCI->FilePath);
        ppuVar18 = (pointer *)local_f8._0_8_;
        if ((pointer *)local_f8._0_8_ == (pointer *)0x0) {
          ppuVar18 = (pointer *)0x0;
        }
        else {
          local_f8._0_8_ = (pointer *)0x0;
        }
        uVar13 = local_f8._16_4_;
        if ((pointer *)local_f8._0_8_ != (pointer *)0x0) {
          (**(code **)(*(pointer *)local_f8._0_8_ + 4))();
          local_f8._0_8_ = (pointer *)0x0;
        }
        pSVar15 = (ShaderCI->Macros).Elements;
        UStack_d8 = (ShaderCI->Macros).Count;
        ppuVar17 = (pointer *)local_f8._8_8_;
      }
      else {
        local_f8._8_8_ = VkShaderCI->AdapterInfo;
        pRVar3 = VkShaderCI->DeviceInfo;
        local_f8._16_8_ = &pRVar3->Features;
        local_f8._24_4_ = pRVar3->Type;
        VVar5 = (pRVar3->MaxShaderVersion).HLSL;
        VVar6 = (pRVar3->MaxShaderVersion).GLSL;
        VVar7 = (pRVar3->MaxShaderVersion).GLESSL;
        VVar8 = (pRVar3->MaxShaderVersion).MSL;
        local_f8._28_4_ = VVar5.Major;
        UStack_d8 = VVar5.Minor;
        UStack_d4 = VVar6.Major;
        UStack_d0 = VVar6.Minor;
        UStack_cc = VVar7.Major;
        SStack_c8 = VVar7.Minor;
        UStack_c4 = VVar8.Major;
        UStack_c0 = VVar8.Minor;
        uStack_bc = 0;
        local_b8 = CONCAT11(local_b8._1_1_,true);
        local_b0 = "#ifndef VULKAN\n#   define VULKAN 1\n#endif\n\n";
        local_a8 = 0;
        local_f8._0_8_ = ShaderCI;
        BuildGLSLSourceString_abi_cxx11_(&local_78,(Diligent *)local_f8,Attribs);
        std::__cxx11::string::operator=((string *)&local_118,(string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,
                          (ulong)(local_78.field_2._M_allocated_capacity + 1));
        }
        ppuVar17 = (pointer *)
                   local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start;
        local_f8._0_8_ =
             local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        uVar13 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)local_f8);
        ppuVar18 = (pointer *)0x0;
        UStack_d8 = 0;
        pSVar15 = (ShaderMacro *)0x0;
      }
      local_f8._0_8_ = CONCAT44(SUB84(local_f8._0_8_,4),(ShaderCI->Desc).ShaderType);
      local_f8._16_8_ = CONCAT44(SUB84(local_f8._16_8_,4),uVar13);
      SStack_c8 = Vk100;
      local_f8._24_4_ = SUB84(pSVar15,0);
      local_f8._28_4_ = (undefined4)((ulong)pSVar15 >> 0x20);
      local_b8 = CONCAT11((byte)(char)ShaderCI->CompileFlags >> 3,1) & 0x1ff;
      UStack_d0 = (Uint32)ShaderCI->pShaderSourceStreamFactory;
      UStack_cc = (Uint32)((ulong)ShaderCI->pShaderSourceStreamFactory >> 0x20);
      UStack_c0 = (Uint32)VkShaderCI->ppCompilerOutput;
      uStack_bc = (undefined4)((ulong)VkShaderCI->ppCompilerOutput >> 0x20);
      SVar12 = Vk120;
      if ((VkShaderCI->VkVersion < 0x402000) &&
         (SVar12 = SStack_c8, 0x400fff < VkShaderCI->VkVersion)) {
        SVar12 = VkShaderCI->HasSpirv14 + Vk110;
      }
      SStack_c8 = SVar12;
      local_f8._8_8_ = ppuVar17;
      GLSLangUtils::GLSLtoSPIRV
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                 (GLSLtoSPIRVAttribs *)local_f8);
      pDVar9 = local_88;
      ppuVar17 = local_98;
      local_98 = (pointer *)local_78._M_dataplus._M_p;
      ppuStack_90 = (pointer *)local_78._M_string_length;
      local_88 = (DeviceFeatures *)local_78.field_2._M_allocated_capacity;
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity = 0;
      if (ppuVar17 != (pointer *)0x0) {
        operator_delete(ppuVar17,(long)pDVar9 - (long)ppuVar17);
      }
      if ((pointer *)local_78._M_dataplus._M_p != (pointer *)0x0) {
        operator_delete(local_78._M_dataplus._M_p,
                        local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
      }
      if (ppuVar18 != (pointer *)0x0) {
        (**(code **)(*ppuVar18 + 4))(ppuVar18);
      }
      if ((pointer *)
          local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        pDVar16 = (DEVICE_FEATURE_STATE *)
                  ((long)local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        ppuVar17 = (pointer *)
                   local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start;
        goto LAB_002293b0;
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(&this->m_SPIRV);
    ppuVar17 = local_98;
    pDVar9 = local_88;
joined_r0x00229430:
    if (ppuVar17 != (pointer *)0x0) {
      operator_delete(ppuVar17,(long)pDVar9 - (long)ppuVar17);
    }
  }
  else {
    if ((uint)Args_1 == 2) {
      pIVar2 = VkShaderCI->pDXCompiler;
      if ((pIVar2 == (IDXCompiler *)0x0) ||
         (iVar14 = (*pIVar2->_vptr_IDXCompiler[3])(pIVar2), (char)iVar14 == '\0')) {
        FormatString<char[26],char[50]>
                  ((string *)local_f8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pDXCompiler != nullptr && pDXCompiler->IsLoaded()",Args_1);
        DebugAssertionFailed
                  ((Char *)local_f8._0_8_,"CompileShaderDXC",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0x48);
        if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
      }
      local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (*pIVar2->_vptr_IDXCompiler[6])
                (pIVar2,ShaderCI,ShaderCI->HLSLVersion,
                 "#ifndef VULKAN\n#   define VULKAN 1\n#endif\n\n",0,&local_118,
                 VkShaderCI->ppCompilerOutput);
      if (local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        OptimizeSPIRV((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,&local_118,
                      SPV_ENV_MAX,SPIRV_OPTIMIZATION_FLAG_LEGALIZATION);
        puVar11 = local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        puVar10 = local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_f8._0_8_ == local_f8._8_8_) {
          LogError<false,char[93]>
                    (false,"CompileShaderDXC",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                     ,0x55,(char (*) [93])
                           "Failed to legalize SPIR-V shader generated from HLSL. This may result in undefined behavior."
                    );
        }
        else {
          local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_f8._0_8_;
          local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_f8._8_8_;
          local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_f8._16_8_;
          local_f8._0_8_ = (pointer *)0x0;
          local_f8._8_8_ = (pointer *)0x0;
          local_f8._16_8_ = (DeviceFeatures *)0x0;
          if ((pointer *)puVar10 != (pointer *)0x0) {
            operator_delete(puVar10,(long)puVar11 - (long)puVar10);
          }
        }
        if ((pointer *)local_f8._0_8_ != (pointer *)0x0) {
          operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
        }
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(&this->m_SPIRV);
      ppuVar17 = (pointer *)
                 local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pDVar9 = (DeviceFeatures *)
               local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      goto joined_r0x00229430;
    }
    LogError<true,char[28]>
              (false,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
               ,0xc2,(char (*) [28])"Unsupported shader compiler");
  }
  if ((this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_f8[0] = 0x27;
    LogError<true,char[27],char_const*,char>
              (false,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
               ,199,(char (*) [27])"Failed to compile shader \'",
               (char **)&(this->super_ShaderBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                         .m_Desc,local_f8);
  }
LAB_00229480:
  if ((this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_SPIRV).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_SKIP_REFLECTION) == SHADER_COMPILE_FLAG_NONE)
    {
      Allocator = GetRawAllocator();
      iVar14 = (**Allocator->_vptr_IMemoryAllocator)
                         (Allocator,0x58,"Memory for SPIRVShaderResources",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                         );
      SVar1 = (this->super_ShaderBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
              .m_Desc.ShaderType;
      local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)Allocator;
      local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)CONCAT44(extraout_var,iVar14);
      local_58 = &this->m_SPIRV;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,&this->m_SPIRV);
      shaderDesc = &(this->super_ShaderBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                    .m_Desc;
      if ((this->super_ShaderBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
          .m_Desc.UseCombinedTextureSamplers == false) {
        CombinedSamplerSuffix = (char *)0x0;
      }
      else {
        CombinedSamplerSuffix =
             (this->super_ShaderBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
             .m_Desc.CombinedSamplerSuffix;
      }
      EntryPoint = &this->m_EntryPoint;
      SPIRVShaderResources::SPIRVShaderResources
                ((SPIRVShaderResources *)CONCAT44(extraout_var,iVar14),Allocator,&local_50,
                 shaderDesc,CombinedSamplerSuffix,SVar1 == SHADER_TYPE_VERTEX,
                 ShaderCI->LoadConstantBufferReflection,EntryPoint);
      if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_50.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (((ShaderCI->ByteCode == (void *)0x0) &&
          (iVar14 = std::__cxx11::string::compare((char *)EntryPoint), iVar14 != 0)) &&
         ((iVar14 = std::__cxx11::string::compare((char *)EntryPoint), iVar14 != 0 ||
          ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) ==
           SHADER_COMPILE_FLAG_NONE)))) {
        FormatString<char[26],char[173]>
                  ((string *)local_f8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ShaderCI.ByteCode != nullptr || m_EntryPoint == ShaderCI.EntryPoint || (m_EntryPoint == \"main\" && (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) != 0)"
                   ,(char (*) [173])shaderDesc);
        DebugAssertionFailed
                  ((Char *)local_f8._0_8_,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0xf0);
        if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
          operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        }
      }
      puVar10 = local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.m_Allocator = Allocator;
      std::__shared_ptr<Diligent::SPIRVShaderResources_const,(__gnu_cxx::_Lock_policy)2>::
      reset<Diligent::SPIRVShaderResources,Diligent::STDDeleter<Diligent::SPIRVShaderResources,Diligent::IMemoryAllocator>>
                ((__shared_ptr<Diligent::SPIRVShaderResources_const,(__gnu_cxx::_Lock_policy)2> *)
                 &this->m_pShaderResources,(SPIRVShaderResources *)puVar10,&local_38);
      if ((SVar1 == SHADER_TYPE_VERTEX) &&
         (this_00 = (this->m_pShaderResources).
                    super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr, this_00->m_IsHLSLSource == true)) {
        SPIRVShaderResources::MapHLSLVertexShaderInputs(this_00,local_58);
      }
      if (local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
                  ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&local_118,
                   local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish);
      }
    }
    else {
      __s = ShaderCI->EntryPoint;
      pcVar4 = (char *)(this->m_EntryPoint)._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&this->m_EntryPoint,0,pcVar4,(ulong)__s);
    }
    LOCK();
    (this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_Status._M_i = SHADER_STATUS_READY;
    UNLOCK();
  }
  return;
}

Assistant:

void ShaderVkImpl::Initialize(const ShaderCreateInfo& ShaderCI,
                              const CreateInfo&       VkShaderCI)
{
    if (ShaderCI.Source != nullptr || ShaderCI.FilePath != nullptr)
    {
        DEV_CHECK_ERR(ShaderCI.ByteCode == nullptr, "'ByteCode' must be null when shader is created from source code or a file");

        SHADER_COMPILER ShaderCompiler = ShaderCI.ShaderCompiler;
        if (ShaderCompiler == SHADER_COMPILER_DXC)
        {
            IDXCompiler* pDXCompiler = VkShaderCI.pDXCompiler;
            if (pDXCompiler == nullptr || !pDXCompiler->IsLoaded())
            {
                LOG_WARNING_MESSAGE("DX Compiler is not loaded. Using default shader compiler");
                ShaderCompiler = SHADER_COMPILER_DEFAULT;
            }
        }

        switch (ShaderCompiler)
        {
            case SHADER_COMPILER_DXC:
                m_SPIRV = CompileShaderDXC(ShaderCI, VkShaderCI);
                break;

            case SHADER_COMPILER_DEFAULT:
            case SHADER_COMPILER_GLSLANG:
                m_SPIRV = CompileShaderGLSLang(ShaderCI, VkShaderCI);
                break;

            default:
                LOG_ERROR_AND_THROW("Unsupported shader compiler");
        }

        if (m_SPIRV.empty())
        {
            LOG_ERROR_AND_THROW("Failed to compile shader '", m_Desc.Name, '\'');
        }
    }
    else if (ShaderCI.ByteCode != nullptr)
    {
        DEV_CHECK_ERR(ShaderCI.ByteCodeSize != 0, "ByteCodeSize must not be 0");
        DEV_CHECK_ERR(ShaderCI.ByteCodeSize % 4 == 0, "Byte code size (", ShaderCI.ByteCodeSize, ") is not multiple of 4");
        m_SPIRV.resize(ShaderCI.ByteCodeSize / 4);
        memcpy(m_SPIRV.data(), ShaderCI.ByteCode, ShaderCI.ByteCodeSize);
    }
    else
    {
        LOG_ERROR_AND_THROW("Shader source must be provided through one of the 'Source', 'FilePath' or 'ByteCode' members");
    }

    // We cannot create shader module here because resource bindings are assigned when
    // pipeline state is created

    // Load shader resources
    if (!m_SPIRV.empty())
    {
        if ((ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_SKIP_REFLECTION) == 0)
        {
            IMemoryAllocator& Allocator = GetRawAllocator();

            std::unique_ptr<void, STDDeleterRawMem<void>> pRawMem{
                ALLOCATE(Allocator, "Memory for SPIRVShaderResources", SPIRVShaderResources, 1),
                STDDeleterRawMem<void>(Allocator),
            };
            const bool LoadShaderInputs = m_Desc.ShaderType == SHADER_TYPE_VERTEX;
            new (pRawMem.get()) SPIRVShaderResources // May throw
                {
                    Allocator,
                    m_SPIRV,
                    m_Desc,
                    m_Desc.UseCombinedTextureSamplers ? m_Desc.CombinedSamplerSuffix : nullptr,
                    LoadShaderInputs,
                    ShaderCI.LoadConstantBufferReflection,
                    m_EntryPoint //
                };
            VERIFY_EXPR(ShaderCI.ByteCode != nullptr || m_EntryPoint == ShaderCI.EntryPoint ||
                        (m_EntryPoint == "main" && (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) != 0));
            m_pShaderResources.reset(static_cast<SPIRVShaderResources*>(pRawMem.release()), STDDeleterRawMem<SPIRVShaderResources>(Allocator));

            if (LoadShaderInputs && m_pShaderResources->IsHLSLSource())
            {
                m_pShaderResources->MapHLSLVertexShaderInputs(m_SPIRV);
            }
        }
        else
        {
            m_EntryPoint = ShaderCI.EntryPoint;
        }

        m_Status.store(SHADER_STATUS_READY);
    }
}